

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::
erase(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *this,
     Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *pSVar2;
  size_t to;
  Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *fromSpan;
  ulong uVar3;
  Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *pSVar4;
  Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *pSVar5;
  Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *this_00;
  size_t sVar6;
  size_t fromIndex;
  
  to = bucket.index;
  fromSpan = bucket.span;
  bVar1 = fromSpan->offsets[to];
  fromSpan->offsets[to] = 0xff;
  fromSpan->entries[bVar1].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar1;
  this->size = this->size - 1;
  this_00 = fromSpan;
  fromIndex = to;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      fromSpan = fromSpan + 1;
      if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        fromSpan = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = fromSpan->offsets[fromIndex];
    if ((ulong)bVar1 != 0xff) {
      uVar3 = *(ulong *)fromSpan->entries[bVar1].storage.data;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
      uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
      uVar3 = this->numBuckets - 1 & (uVar3 >> 0x20 ^ this->seed ^ uVar3);
      pSVar4 = pSVar2 + (uVar3 >> 7);
      sVar6 = (size_t)((uint)uVar3 & 0x7f);
      if (sVar6 != fromIndex || pSVar4 != fromSpan) {
        do {
          if ((pSVar4 == this_00) && (sVar6 == to)) {
            if (fromSpan == this_00) {
              this_00->offsets[to] = this_00->offsets[fromIndex];
              this_00->offsets[fromIndex] = 0xff;
              to = fromIndex;
              this_00 = fromSpan;
            }
            else {
              Span<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::
              moveFromSpan(this_00,fromSpan,fromIndex,to);
              to = fromIndex;
              this_00 = fromSpan;
            }
            break;
          }
          sVar6 = sVar6 + 1;
          if (sVar6 == 0x80) {
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar2;
            if (((long)pSVar5 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar4 = pSVar5;
            }
            sVar6 = 0;
          }
        } while ((pSVar4 != fromSpan) || (sVar6 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }